

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O2

Status __thiscall
sentencepiece::SentencePieceTrainer::MergeSpecsFromArgs
          (SentencePieceTrainer *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *kwargs,TrainerSpec *trainer_spec,NormalizerSpec *normalizer_spec,
          NormalizerSpec *denormalizer_spec)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  NormalizerSpec *result;
  int iVar2;
  Status *s;
  __node_base *p_Var3;
  string_view s_00;
  string_view name;
  string_view name_00;
  string_view value;
  string_view value_00;
  Status status_norm;
  Status status_train;
  ostringstream local_1a8 [376];
  
  if (trainer_spec == (TrainerSpec *)0x0) {
    status_train.rep_._M_t.
    super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
    ._M_t.
    super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
    .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"third_party/sentencepiece/src/sentencepiece_trainer.cc");
    std::operator<<((ostream *)local_1a8,"(");
    std::ostream::operator<<(local_1a8,0x85);
    std::operator<<((ostream *)local_1a8,") [");
    std::operator<<((ostream *)local_1a8,"trainer_spec");
    std::operator<<((ostream *)local_1a8,"] ");
    std::operator<<((ostream *)local_1a8,"`trainer_spec` must not be null.");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  else if (normalizer_spec == (NormalizerSpec *)0x0) {
    status_train.rep_._M_t.
    super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
    ._M_t.
    super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
    .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"third_party/sentencepiece/src/sentencepiece_trainer.cc");
    std::operator<<((ostream *)local_1a8,"(");
    std::ostream::operator<<(local_1a8,0x86);
    std::operator<<((ostream *)local_1a8,") [");
    std::operator<<((ostream *)local_1a8,"normalizer_spec");
    std::operator<<((ostream *)local_1a8,"] ");
    std::operator<<((ostream *)local_1a8,"`normalizer_spec` must not be null.");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  else {
    if (denormalizer_spec != (NormalizerSpec *)0x0) {
      p_Var3 = &(kwargs->_M_h)._M_before_begin;
      result = normalizer_spec;
      do {
        while( true ) {
          while( true ) {
            p_Var3 = p_Var3->_M_nxt;
            if (p_Var3 == (__node_base *)0x0) {
              util::Status::Status((Status *)this);
              return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                      )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                        )this;
            }
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (p_Var3 + 1);
            bVar1 = std::operator==(__lhs,"normalization_rule_name");
            if (!bVar1) break;
            NormalizerSpec::_internal_set_name(normalizer_spec,(string *)(p_Var3 + 5));
          }
          bVar1 = std::operator==(__lhs,"denormalization_rule_tsv");
          if (!bVar1) break;
          NormalizerSpec::_internal_set_normalization_rule_tsv
                    (denormalizer_spec,(string *)(p_Var3 + 5));
          denormalizer_spec->add_dummy_prefix_ = false;
          denormalizer_spec->remove_extra_whitespaces_ = false;
          *(byte *)(denormalizer_spec->_has_bits_).has_bits_ =
               (byte)(denormalizer_spec->_has_bits_).has_bits_[0] | 0x38;
          denormalizer_spec->escape_whitespaces_ = false;
        }
        bVar1 = std::operator==(__lhs,"minloglevel");
        if (bVar1) {
          status_norm.rep_._M_t.
          super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          ._M_t.
          super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
          .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._0_4_ = 0;
          s_00._M_str = (char *)&status_norm;
          s_00._M_len = (size_t)p_Var3[5]._M_nxt;
          bVar1 = absl::SimpleAtoi<int>((absl *)p_Var3[6]._M_nxt,s_00,(int *)result);
          if (bVar1) {
            logging::SetMinLogLevel
                      ((int)status_norm.rep_._M_t.
                            super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                            .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                            _M_head_impl);
            iVar2 = 3;
          }
          else {
            status_train.rep_._M_t.
            super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            ._M_t.
            super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
            .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._0_4_ =
                 0xd;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::operator<<((ostream *)local_1a8,
                            "third_party/sentencepiece/src/sentencepiece_trainer.cc");
            std::operator<<((ostream *)local_1a8,"(");
            std::ostream::operator<<(local_1a8,0x98);
            std::operator<<((ostream *)local_1a8,") [");
            std::operator<<((ostream *)local_1a8,"absl::SimpleAtoi(value, &v)");
            std::operator<<((ostream *)local_1a8,"] ");
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            iVar2 = 1;
          }
        }
        else {
          result = (NormalizerSpec *)p_Var3[6]._M_nxt;
          name._M_str = (char *)*(_Hash_node_base **)
                                 &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
          name._M_len = (size_t)&status_train;
          value._M_str = (char *)result;
          value._M_len = (size_t)p_Var3[1]._M_nxt;
          SetProtoField(name,value,(TrainerSpec *)p_Var3[5]._M_nxt);
          iVar2 = 3;
          if (CONCAT44(status_train.rep_._M_t.
                       super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                       _M_head_impl._4_4_,
                       status_train.rep_._M_t.
                       super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                       _M_head_impl._0_4_) != 0) {
            bVar1 = util::IsNotFound(&status_train);
            if (bVar1) {
              result = (NormalizerSpec *)p_Var3[6]._M_nxt;
              name_00._M_str =
                   (char *)*(_Hash_node_base **)
                            &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
              name_00._M_len = (size_t)&status_norm;
              value_00._M_str = (char *)result;
              value_00._M_len = (size_t)p_Var3[1]._M_nxt;
              SetProtoField(name_00,value_00,(NormalizerSpec *)p_Var3[5]._M_nxt);
              iVar2 = 3;
              if (CONCAT44(status_norm.rep_._M_t.
                           super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                           .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                           _M_head_impl._4_4_,
                           (int)status_norm.rep_._M_t.
                                super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                                _M_head_impl) != 0) {
                bVar1 = util::IsNotFound(&status_norm);
                s = &status_norm;
                if (bVar1) {
                  bVar1 = util::IsNotFound(&status_train);
                  iVar2 = 0;
                  if (bVar1) {
                    bVar1 = util::IsNotFound(&status_norm);
                    s = &status_train;
                    if (bVar1) goto LAB_00240957;
                  }
                }
                else {
LAB_00240957:
                  util::Status::Status((Status *)this,s);
                  iVar2 = 1;
                }
              }
              util::Status::~Status(&status_norm);
            }
            else {
              util::Status::Status((Status *)this,&status_train);
              iVar2 = 1;
            }
          }
          util::Status::~Status(&status_train);
        }
        if ((iVar2 != 0) && (iVar2 != 3)) {
          return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                  )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                    )this;
        }
      } while( true );
    }
    status_train.rep_._M_t.
    super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
    ._M_t.
    super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
    .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"third_party/sentencepiece/src/sentencepiece_trainer.cc");
    std::operator<<((ostream *)local_1a8,"(");
    std::ostream::operator<<(local_1a8,0x87);
    std::operator<<((ostream *)local_1a8,") [");
    std::operator<<((ostream *)local_1a8,"denormalizer_spec");
    std::operator<<((ostream *)local_1a8,"] ");
    std::operator<<((ostream *)local_1a8,"`denormalizer_spec` must not be null.");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceTrainer::MergeSpecsFromArgs(
    const std::unordered_map<std::string, std::string> &kwargs,
    TrainerSpec *trainer_spec, NormalizerSpec *normalizer_spec,
    NormalizerSpec *denormalizer_spec) {
  CHECK_OR_RETURN(trainer_spec) << "`trainer_spec` must not be null.";
  CHECK_OR_RETURN(normalizer_spec) << "`normalizer_spec` must not be null.";
  CHECK_OR_RETURN(denormalizer_spec) << "`denormalizer_spec` must not be null.";

  for (const auto &it : kwargs) {
    const auto &key = it.first;
    const auto &value = it.second;
    // Exceptions.
    if (key == "normalization_rule_name") {
      normalizer_spec->set_name(value);
      continue;
    } else if (key == "denormalization_rule_tsv") {
      denormalizer_spec->set_normalization_rule_tsv(value);
      denormalizer_spec->set_add_dummy_prefix(false);
      denormalizer_spec->set_remove_extra_whitespaces(false);
      denormalizer_spec->set_escape_whitespaces(false);
      continue;
    } else if (key == "minloglevel") {
      int v = 0;
      CHECK_OR_RETURN(absl::SimpleAtoi(value, &v));
      logging::SetMinLogLevel(v);
      continue;
    }

    const auto status_train = SetProtoField(key, value, trainer_spec);
    if (status_train.ok()) continue;
    if (!util::IsNotFound(status_train)) return status_train;

    const auto status_norm = SetProtoField(key, value, normalizer_spec);
    if (status_norm.ok()) continue;
    if (!util::IsNotFound(status_norm)) return status_norm;

    // Not found both in trainer_spec and normalizer_spec.
    if (util::IsNotFound(status_train) && util::IsNotFound(status_norm)) {
      return status_train;
    }
  }

  return util::OkStatus();
}